

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O1

void e2e_multi_kvs_concurrent_wr(void)

{
  fdb_status fVar1;
  int iVar2;
  time_t tVar3;
  size_t valuelen;
  fdb_kvs_handle *pfVar4;
  fdb_file_handle *ptr_fhandle;
  uint uVar5;
  ulong unaff_RBP;
  char *pcVar6;
  fdb_kvs_handle **ppfVar7;
  ulong uVar8;
  long lVar9;
  fdb_kvs_handle **ppfVar10;
  char *keylen;
  fdb_kvs_handle **ptr_handle;
  fdb_file_handle *dbfile;
  fdb_iterator *it;
  fdb_doc *rdoc;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  char buf [64];
  char body [64];
  fdb_config fconfig;
  fdb_file_handle fStackY_600;
  undefined1 auStackY_5d8 [24];
  timeval tStackY_5c0;
  fdb_kvs_handle *apfStackY_5b0 [16];
  pthread_t apStackY_530 [16];
  char acStackY_4b0 [72];
  fdb_config fStackY_468;
  void *apvStackY_370 [17];
  fdb_kvs_handle *pfStackY_2e8;
  char *pcStackY_2e0;
  ulong uStackY_2d8;
  fdb_kvs_handle **ppfStackY_2d0;
  char *pcStackY_2c8;
  code *pcStackY_2c0;
  fdb_file_handle *local_2b0;
  fdb_iterator *local_2a8;
  fdb_kvs_handle *local_2a0;
  fdb_kvs_handle *local_298 [9];
  timeval local_250;
  undefined1 local_240 [216];
  char local_168 [64];
  fdb_config local_128;
  
  pcStackY_2c0 = (code *)0x10899f;
  gettimeofday(&local_250,(__timezone_ptr_t)0x0);
  pcStackY_2c0 = (code *)0x1089a4;
  memleak_start();
  local_2a0 = (fdb_kvs_handle *)0x0;
  pcStackY_2c0 = (code *)0x1089b4;
  tVar3 = time((time_t *)0x0);
  pcStackY_2c0 = (code *)0x1089bb;
  srand((uint)tVar3);
  pcStackY_2c0 = (code *)0x1089c0;
  rm_storage_fs();
  pcStackY_2c0 = (code *)0x1089cc;
  system("rm -rf  e2edb_main > errorlog.txt");
  pcStackY_2c0 = (code *)0x1089dc;
  fdb_get_default_config();
  local_128.num_keeping_headers = 10;
  pfVar4 = (fdb_kvs_handle *)local_240;
  pcStackY_2c0 = (code *)0x1089f4;
  fdb_get_default_kvs_config();
  local_128.compaction_mode = '\0';
  pcStackY_2c0 = (code *)0x108a0d;
  fdb_open(&local_2b0,"e2edb_main",&local_128);
  ppfVar10 = local_298;
  keylen = "e2edb_kv%d";
  pcVar6 = local_240 + 0x58;
  uVar8 = 0;
  do {
    pcStackY_2c0 = (code *)0x108a34;
    sprintf(pcVar6,"e2edb_kv%d",uVar8 & 0xffffffff);
    pcStackY_2c0 = (code *)0x108a47;
    fVar1 = fdb_kvs_open(local_2b0,ppfVar10,pcVar6,(fdb_kvs_config *)pfVar4);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00108c84;
    uVar8 = uVar8 + 1;
    ppfVar10 = ppfVar10 + 1;
  } while (uVar8 != 8);
  ppfVar10 = (fdb_kvs_handle **)(local_240 + 0x58);
  pcVar6 = local_168;
  unaff_RBP = 0;
  do {
    uVar8 = 0;
    do {
      pcStackY_2c0 = (code *)0x108a87;
      sprintf((char *)ppfVar10,"%dkey%d",unaff_RBP,uVar8 & 0xffffffff);
      pcStackY_2c0 = (code *)0x108a9a;
      sprintf(pcVar6,"commit%d",unaff_RBP);
      pfVar4 = local_298[uVar8];
      pcStackY_2c0 = (code *)0x108aa7;
      keylen = (char *)strlen((char *)ppfVar10);
      pcStackY_2c0 = (code *)0x108ab2;
      valuelen = strlen(pcVar6);
      pcStackY_2c0 = (code *)0x108ac6;
      fVar1 = fdb_set_kv(pfVar4,ppfVar10,(size_t)keylen,pcVar6,valuelen);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pcStackY_2c0 = (code *)0x108c7f;
        e2e_multi_kvs_concurrent_wr();
        goto LAB_00108c7f;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != 8);
    pcStackY_2c0 = (code *)0x108ae6;
    fVar1 = fdb_commit(local_2b0,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00108c89;
    uVar5 = (int)unaff_RBP + 1;
    unaff_RBP = (ulong)uVar5;
  } while (uVar5 != 10);
  lVar9 = 0;
  do {
    pcStackY_2c0 = (code *)0x108b1d;
    pthread_create((pthread_t *)(local_240 + lVar9 + 0x18),(pthread_attr_t *)0x0,update_thread,
                   *(void **)((long)local_298 + lVar9));
    lVar9 = lVar9 + 8;
  } while (lVar9 != 0x40);
  pfVar4 = (fdb_kvs_handle *)0x0;
  do {
    pcStackY_2c0 = (code *)0x108b41;
    pthread_join(*(pthread_t *)((long)&pfVar4->kvs + (long)local_240),
                 (void **)(local_240 + 0x28 + (long)&(pfVar4->config).chunksize));
    pcStackY_2c0 = (code *)0x108b53;
    fVar1 = fdb_rollback((fdb_kvs_handle **)((long)local_298 + (long)pfVar4),7);
    ppfVar10 = (fdb_kvs_handle **)0x40;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00108c8e;
    pfVar4 = (fdb_kvs_handle *)&(pfVar4->kvs_config).custom_cmp;
  } while (pfVar4 != (fdb_kvs_handle *)0x40);
  pcStackY_2c0 = (code *)0x108b74;
  fVar1 = fdb_commit(local_2b0,'\x01');
  if (fVar1 == FDB_RESULT_SUCCESS) {
    keylen = (char *)0x0;
    pfVar4 = (fdb_kvs_handle *)&local_2a8;
    ppfVar10 = &local_2a0;
    while( true ) {
      pcStackY_2c0 = (code *)0x108ba7;
      fVar1 = fdb_iterator_init(local_298[(long)keylen],(fdb_iterator **)pfVar4,(void *)0x0,0,
                                (void *)0x0,0,0);
      if (fVar1 != FDB_RESULT_SUCCESS) break;
      unaff_RBP = 7;
      do {
        pcStackY_2c0 = (code *)0x108bc1;
        fVar1 = fdb_iterator_get(local_2a8,(fdb_doc **)ppfVar10);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00108c7f;
        pcStackY_2c0 = (code *)0x108bd3;
        fdb_doc_free((fdb_doc *)local_2a0);
        local_2a0 = (fdb_kvs_handle *)0x0;
        pcStackY_2c0 = (code *)0x108be6;
        fVar1 = fdb_iterator_next(local_2a8);
        uVar5 = (int)unaff_RBP - 1;
        unaff_RBP = (ulong)uVar5;
      } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
      if (uVar5 != 0) goto LAB_00108c98;
      pcStackY_2c0 = (code *)0x108bff;
      fdb_iterator_close(local_2a8);
      keylen = keylen + 1;
      if (keylen == (char *)0x8) {
        pcStackY_2c0 = (code *)0x108c17;
        fdb_commit(local_2b0,'\x01');
        pcStackY_2c0 = (code *)0x108c21;
        fdb_close(local_2b0);
        pcStackY_2c0 = (code *)0x108c26;
        fdb_shutdown();
        pcStackY_2c0 = (code *)0x108c2b;
        memleak_end();
        pcStackY_2c0 = (code *)0x108c37;
        system("rm -rf  e2edb_main > errorlog.txt");
        pcVar6 = "%s PASSED\n";
        if (e2e_multi_kvs_concurrent_wr()::__test_pass != '\0') {
          pcVar6 = "%s FAILED\n";
        }
        pcStackY_2c0 = (code *)0x108c68;
        fprintf(_stderr,pcVar6,"TEST: e2e multi kvs concurrent wr test");
        return;
      }
    }
    goto LAB_00108c93;
  }
LAB_00108c9d:
  pcStackY_2c0 = e2e_multi_kvs_concurrent_wr_compact;
  e2e_multi_kvs_concurrent_wr();
  pfStackY_2e8 = pfVar4;
  pcStackY_2e0 = pcVar6;
  uStackY_2d8 = uVar8;
  ppfStackY_2d0 = ppfVar10;
  pcStackY_2c8 = keylen;
  pcStackY_2c0 = (code *)unaff_RBP;
  gettimeofday(&tStackY_5c0,(__timezone_ptr_t)0x0);
  memleak_start();
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  rm_storage_fs();
  system("rm -rf  e2edb_ex* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStackY_468.compaction_mode = '\0';
  ppfVar10 = apfStackY_5b0;
  uVar8 = 0;
  iVar2 = 0;
  do {
    sprintf(acStackY_4b0,"e2edb_ex%d",uVar8 & 0xffffffff);
    ptr_fhandle = (fdb_file_handle *)((long)&fStackY_600 + uVar8 * 8);
    pcVar6 = acStackY_4b0;
    pfVar4 = (fdb_kvs_handle *)ptr_fhandle;
    fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,acStackY_4b0,&fStackY_468);
    uVar5 = (uint)pcVar6;
    if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_00108eb3:
      e2e_multi_kvs_concurrent_wr_compact();
      goto LAB_00108eb8;
    }
    lVar9 = 0;
    ptr_handle = ppfVar10;
    do {
      sprintf(acStackY_4b0,"e2edb_kv%d",(ulong)(uint)((int)lVar9 + iVar2));
      pfVar4 = ptr_fhandle->root;
      ppfVar7 = ptr_handle;
      fVar1 = fdb_kvs_open((fdb_file_handle *)pfVar4,ptr_handle,acStackY_4b0,
                           (fdb_kvs_config *)auStackY_5d8);
      uVar5 = (uint)ppfVar7;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        e2e_multi_kvs_concurrent_wr_compact();
        goto LAB_00108eb3;
      }
      lVar9 = lVar9 + 1;
      ptr_handle = ptr_handle + 1;
    } while (lVar9 != 4);
    uVar8 = uVar8 + 1;
    iVar2 = iVar2 + 4;
    ppfVar10 = ppfVar10 + 4;
  } while (uVar8 != 4);
  lVar9 = 0;
  do {
    pfVar4 = *(fdb_kvs_handle **)((long)&fStackY_600 + lVar9 * 8);
    uVar5 = 1;
    fVar1 = fdb_commit((fdb_file_handle *)pfVar4,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00108eb8;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  lVar9 = 0;
  do {
    pthread_create((pthread_t *)((long)apStackY_530 + lVar9),(pthread_attr_t *)0x0,update_thread,
                   *(void **)((long)apfStackY_5b0 + lVar9));
    lVar9 = lVar9 + 8;
  } while (lVar9 != 0x80);
  lVar9 = 0;
  do {
    pthread_join(*(pthread_t *)((long)apStackY_530 + lVar9),(void **)((long)apvStackY_370 + lVar9));
    lVar9 = lVar9 + 8;
  } while (lVar9 != 0x80);
  lVar9 = 0;
  while( true ) {
    pfVar4 = *(fdb_kvs_handle **)((long)&fStackY_600 + lVar9 * 8);
    uVar5 = 1;
    fVar1 = fdb_commit((fdb_file_handle *)pfVar4,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) break;
    lVar9 = lVar9 + 1;
    if (lVar9 == 4) {
      lVar9 = 0;
      do {
        fdb_close(*(fdb_file_handle **)((long)&fStackY_600 + lVar9 * 8));
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
      fdb_shutdown();
      memleak_end();
      pcVar6 = "%s PASSED\n";
      if (e2e_multi_kvs_concurrent_wr_compact()::__test_pass != '\0') {
        pcVar6 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar6,"TEST: e2e multi kvs concurrent wr test with compaction");
      return;
    }
  }
LAB_00108ebd:
  e2e_multi_kvs_concurrent_wr_compact();
  if (0 < (int)uVar5) {
    uVar8 = 0;
    do {
      iVar2 = rand();
      *(char *)((long)&((fdb_file_handle *)pfVar4)->root + uVar8) =
           "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"
           [(ulong)(long)iVar2 % 0x3e];
      uVar8 = uVar8 + 1;
    } while (uVar5 != uVar8);
    *(undefined1 *)((long)pfVar4 + ((ulong)uVar5 - 1)) = 0;
  }
  return;
LAB_00108c7f:
  pcStackY_2c0 = (code *)0x108c84;
  e2e_multi_kvs_concurrent_wr();
LAB_00108c84:
  pcStackY_2c0 = (code *)0x108c89;
  e2e_multi_kvs_concurrent_wr();
LAB_00108c89:
  pcStackY_2c0 = (code *)0x108c8e;
  e2e_multi_kvs_concurrent_wr();
LAB_00108c8e:
  pcStackY_2c0 = (code *)0x108c93;
  e2e_multi_kvs_concurrent_wr();
LAB_00108c93:
  pcStackY_2c0 = (code *)0x108c98;
  e2e_multi_kvs_concurrent_wr();
LAB_00108c98:
  pcStackY_2c0 = (code *)0x108c9d;
  e2e_multi_kvs_concurrent_wr();
  goto LAB_00108c9d;
LAB_00108eb8:
  e2e_multi_kvs_concurrent_wr_compact();
  goto LAB_00108ebd;
}

Assistant:

void e2e_multi_kvs_concurrent_wr() {
    TEST_INIT();
    memleak_start();
    int i, j, r;
    int nf = 8;
    char buf[64];
    char body[64];

    thread_t *tid_wr = alca(thread_t, nf);
    void **thread_ret_wr = alca(void *, nf);
    fdb_file_handle *dbfile;
    fdb_kvs_handle **kvs = alca(fdb_kvs_handle*, nf);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    randomize();
    rm_storage_fs();
    r = system(SHELL_DEL" e2edb_main > errorlog.txt");
    fdb_iterator *it;
    (void)r;

    // create dbfile
    fdb_config fconfig = fdb_get_default_config();
    fconfig.num_keeping_headers = 10;
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.compaction_mode  = FDB_COMPACTION_MANUAL;
    fdb_open(&dbfile, "e2edb_main", &fconfig);

    // open dbfiles
    for (i = 0; i < nf; i++) {
        sprintf(buf, "e2edb_kv%d", i);
        status = fdb_kvs_open(dbfile, &kvs[i], buf, &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // initial commits
    for (j = 0; j < 10; j++) {
        for (i = 0; i < nf; i++) {
            sprintf(buf, "%dkey%d", j, i);
            sprintf(body, "commit%d", j);
            status = fdb_set_kv(kvs[i], buf, strlen(buf), body, strlen(body));
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // run update thread on each file to enter reuse
    for (i = 0; i < nf; i++) {
        thread_create(&tid_wr[i], update_thread, (void*)kvs[i]);
    }

    // join and rollback
    for (i = 0; i < nf; i++) {
        thread_join(tid_wr[i], &thread_ret_wr[i]);
        status = fdb_rollback(&kvs[i], 7);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    for (i = 0; i < nf; i++) {
        // verify rollback kvs
        status = fdb_iterator_init(kvs[i], &it, NULL, 0,
                                   NULL, 0, FDB_ITR_NONE);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        j = 0;
        do {
            status = fdb_iterator_get(it, &rdoc);
            TEST_CHK (status == FDB_RESULT_SUCCESS);
            fdb_doc_free(rdoc);
            rdoc=NULL;
            j++;
        } while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);
        TEST_CHK(j==7);
        fdb_iterator_close(it);
    }

    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    fdb_close(dbfile);
    fdb_shutdown();

    memleak_end();

    r = system(SHELL_DEL" e2edb_main > errorlog.txt");
    (void)r;

    TEST_RESULT("TEST: e2e multi kvs concurrent wr test");
}